

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-make.c
# Opt level: O0

wchar_t apply_curse(object *obj,wchar_t lev)

{
  _Bool _Var1;
  int16_t iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  wchar_t power_00;
  wchar_t wVar5;
  int local_30;
  wchar_t local_2c;
  wchar_t tries;
  wchar_t new_lev;
  wchar_t power;
  wchar_t max_curses;
  wchar_t pick;
  wchar_t lev_local;
  object *obj_local;
  
  uVar3 = Rand_div(4);
  uVar4 = Rand_div(9);
  iVar2 = m_bonus(9,lev);
  power_00 = uVar4 + 1 + iVar2 * 10;
  _Var1 = flag_has_dbg(obj->flags,6,0x12,"obj->flags","OF_BLESSED");
  local_2c = lev;
  new_lev = uVar3 + L'\x01';
  obj_local._4_4_ = lev;
  if (!_Var1) {
LAB_001e572b:
    wVar5 = new_lev + L'\xffffffff';
    if (new_lev != L'\0') {
      local_30 = 3;
      do {
        new_lev = wVar5;
        if (local_30 == 0) goto LAB_001e572b;
        uVar3 = Rand_div(z_info->curse_max - 1);
        local_30 = local_30 + -1;
      } while ((curses[uVar3 + L'\x01'].poss[obj->tval] & 1U) == 0);
      _Var1 = append_object_curse(obj,uVar3 + L'\x01',power_00);
      if (_Var1) {
        uVar3 = Rand_div(power_00 / 10 + 1);
        local_2c = uVar3 + 1 + local_2c;
      }
      goto LAB_001e572b;
    }
    obj_local._4_4_ = local_2c;
  }
  return obj_local._4_4_;
}

Assistant:

static int apply_curse(struct object *obj, int lev)
{
	int pick, max_curses = randint1(4);
	int power = randint1(9) + 10 * m_bonus(9, lev);
	int new_lev = lev;

	if (of_has(obj->flags, OF_BLESSED)) return lev;

	while (max_curses--) {
		/* Try to curse it */
		int tries = 3;
		while (tries--) {
			pick = randint1(z_info->curse_max - 1);
			if (curses[pick].poss[obj->tval]) {
				if (append_object_curse(obj, pick, power)) {
					new_lev += randint1(1 + power / 10);
				}
				break;
			}
		}
	}

	return new_lev;
}